

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.h
# Opt level: O2

int usage(char *prg,char *msg,int ret)

{
  int iVar1;
  char *pcVar2;
  
  if (msg != (char *)0x0) {
    printf("%s");
    putchar(10);
  }
  printf("%s","Usage: \'");
  pcVar2 = "";
  if (prg != (char *)0x0) {
    pcVar2 = prg;
  }
  printf("%s",pcVar2);
  printf("%s","\' [options]");
  printf("%s"," [File to compile]");
  putchar(10);
  printf("%s","High performance Parser Generator");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x6c);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("disp_lexem_graph");
  printf("%s",": ");
  printf("%s","display lexem graph");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(99);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("disp_char_graph");
  printf("%s",": ");
  printf("%s","display char graph");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x69);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("disp_inst_graph");
  printf("%s"," arg: ");
  printf("%s",
         "display instruction graph at specified stages (init, mark, merge, boyer, unused, cond, final)"
        );
  printf("%s"," (default=\'");
  puts("\')");
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x70);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("disp_inst_pred");
  printf("%s",": ");
  printf("%s","display instruction predecessors");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x66);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("disp_trans_freq");
  printf("%s",": ");
  printf("%s","display transition frequency");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x74);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("test");
  printf("%s",": ");
  printf("%s","test sipe files");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x62);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("benchmark");
  printf("%s",": ");
  printf("%s","benchmark with training data");
  putchar(10);
  printf("%s","  ");
  printf("%s","--");
  _preparg_dispu("boyer_moore");
  printf("%s",": ");
  printf("%s","Boyer-Moore like optimization");
  putchar(10);
  printf("%s","  ");
  printf("%s","--");
  _preparg_dispu("trace_labels");
  printf("%s",": ");
  printf("%s","Add a print upon labels in generated code");
  putchar(10);
  printf("%s","  ");
  printf("%s","--");
  _preparg_dispu("no_training");
  printf("%s",": ");
  printf("%s","Do not use training data");
  putchar(10);
  printf("%s","  ");
  printf("%s","--");
  _preparg_dispu("never_ending");
  printf("%s",": ");
  printf("%s","true if lack of data is not to be a failure reason");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x6f);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("output");
  printf("%s"," arg: ");
  printf("%s","Name of the output file");
  printf("%s"," (default=\'");
  puts("\')");
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x73);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("style");
  printf("%s"," arg: ");
  printf("%s","Output style (HPIPE_BUFFER, BEG_END or C_STR)");
  printf("%s"," (default=\'");
  printf("%s","HPIPE_BUFFER");
  puts("\')");
  printf("%s","  ");
  printf("%s","--");
  _preparg_dispu("stop_char");
  printf("%s",": ");
  printf("%s","stop char (notably for C_STR style)");
  putchar(10);
  printf("%s","  ");
  putchar(0x2d);
  putchar(0x61);
  printf("%s"," or ");
  printf("%s","--");
  _preparg_dispu("args");
  printf("%s"," arg: ");
  printf("%s","Additionnal parse arguments");
  printf("%s"," (default=\'");
  iVar1 = puts("\')");
  return iVar1;
}

Assistant:

static int usage( const char *prg, const char *msg = 0, int ret = 0 ) {
    if ( msg ) {
        PREPARG_DISP_S( msg );
        PREPARG_DISP_S( "\n" );
    }
    PREPARG_DISP_S( "Usage: '" );
    PREPARG_DISP_S( prg );
    PREPARG_DISP_S( "' [options]" );
    
    // EARG
    #define SARG( SHORT, VAR, HELP, DEFAULT_VALUE )
    #define BARG( SHORT, VAR, HELP, DEFAULT_VALUE )
    #define IARG( SHORT, VAR, HELP, DEFAULT_VALUE )
    #define DARG( SHORT, VAR, HELP, DEFAULT_VALUE )
    #define EARG( VAR, HELP ) PREPARG_DISP_S( " [" HELP "]" );
    #define DESCRIPTION( STR )
    #include PREPARG_FILE
    #include "undefs.h"
    
    PREPARG_DISP_S( "\n" );

    // options
    #define SARG( SHORT, VAR, HELP, DEFAULT_VALUE ) \
        PREPARG_DISP_S( "  " ); \
        if ( SHORT ) { \
            PREPARG_DISP_S( "-" ); \
            PREPARG_DISP_C( SHORT ); \
            PREPARG_DISP_S( " or " ); \
        } \
        PREPARG_DISP_S( "--" ); \
        _preparg_dispu( #VAR ); \
        PREPARG_DISP_S( " arg: " ); \
        PREPARG_DISP_S( HELP ); \
        PREPARG_DISP_S( " (default='" ); \
        PREPARG_DISP_S( DEFAULT_VALUE ); \
        PREPARG_DISP_S( "')\n" )

    #define BARG( SHORT, VAR, HELP, DEFAULT_VALUE ) \
        PREPARG_DISP_S( "  " ); \
        if ( SHORT ) { \
            PREPARG_DISP_S( "-" ); \
            PREPARG_DISP_C( SHORT ); \
            PREPARG_DISP_S( " or " ); \
        } \
        PREPARG_DISP_S( "--" ); \
        _preparg_dispu( #VAR ); \
        PREPARG_DISP_S( ": " ); \
        PREPARG_DISP_S( HELP ); \
        PREPARG_DISP_S( "\n" )

    #define IARG( SHORT, VAR, HELP, DEFAULT_VALUE ) \
        PREPARG_DISP_S( "  " ); \
        if ( SHORT ) { \
            PREPARG_DISP_S( "-" ); \
            PREPARG_DISP_C( SHORT ); \
            PREPARG_DISP_S( " or " ); \
        } \
        PREPARG_DISP_S( "--" ); \
        _preparg_dispu( #VAR ); \
        PREPARG_DISP_S( ": " ); \
        PREPARG_DISP_S( HELP ); \
        PREPARG_DISP_S( "\n" )

    #define DARG( SHORT, VAR, HELP, DEFAULT_VALUE ) \
        PREPARG_DISP_S( "  " ); \
        if ( SHORT ) { \
            PREPARG_DISP_S( "-" ); \
            PREPARG_DISP_C( SHORT ); \
            PREPARG_DISP_S( " or " ); \
        } \
        PREPARG_DISP_S( "--" ); \
        _preparg_dispu( #VAR ); \
        PREPARG_DISP_S( ": " ); \
        PREPARG_DISP_S( HELP ); \
        PREPARG_DISP_S( "\n" )

    #define EARG( VAR, HELP )

    #define DESCRIPTION( STR ) \
        PREPARG_DISP_S( STR ); \
        PREPARG_DISP_S( "\n" )

    #include PREPARG_FILE
    #include "undefs.h"

    return ret;
}